

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.h
# Opt level: O2

void __thiscall HEkkDual::~HEkkDual(HEkkDual *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&this->multi_finish[7].flipList.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x78;
  } while (lVar1 != -0x3c0);
  lVar1 = 0x24d0;
  do {
    MChoice::~MChoice((MChoice *)((long)&this->algorithm + lVar1));
    lVar1 = lVar1 + -0x248;
  } while (lVar1 != 0x1290);
  std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::~vector(&this->slice_dualRow);
  lVar1 = 0;
  do {
    HVectorBase<double>::~HVectorBase
              ((HVectorBase<double> *)((long)&this->slice_row_ap[7].size + lVar1));
    lVar1 = lVar1 + -0xb0;
  } while (lVar1 != -0x580);
  lVar1 = 0;
  do {
    HighsSparseMatrix::~HighsSparseMatrix
              ((HighsSparseMatrix *)((long)this->slice_row_ap + lVar1 + -0x70));
    lVar1 = lVar1 + -0x70;
  } while (lVar1 != -0x380);
  lVar1 = 0;
  do {
    HighsSparseMatrix::~HighsSparseMatrix
              ((HighsSparseMatrix *)((long)&this->slice_ar_matrix[-1].format_ + lVar1));
    lVar1 = lVar1 + -0x70;
  } while (lVar1 != -0x380);
  HEkkDualRHS::~HEkkDualRHS(&this->dualRHS);
  HEkkDualRow::~HEkkDualRow(&this->dualRow);
  HVectorBase<double>::~HVectorBase(&this->dev_col_DSE);
  HVectorBase<double>::~HVectorBase(&this->dev_row_ep);
  HVectorBase<double>::~HVectorBase(&this->col_DSE);
  HVectorBase<double>::~HVectorBase(&this->col_BFRT);
  HVectorBase<double>::~HVectorBase(&this->col_aq);
  HVectorBase<double>::~HVectorBase(&this->row_ap);
  HVectorBase<double>::~HVectorBase(&this->row_ep);
  return;
}

Assistant:

HEkkDual(HEkk& simplex)
      : ekk_instance_(simplex), dualRow(simplex), dualRHS(simplex) {
    initialiseInstance();
    dualRow.setup();
    dualRHS.setup();
    if (!(ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualPlain))
      initialiseInstanceParallel(simplex);
  }